

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

bool __thiscall
vkt::texture::SampleVerifier::verifySampleReport
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,string *report)

{
  bool bVar1;
  ostringstream reportStream;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar1 = verifySampleImpl(this,args,result,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)report,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return bVar1;
}

Assistant:

bool SampleVerifier::verifySampleReport (const SampleArguments&	args,
										 const Vec4&			result,
										 std::string&			report) const
{
	std::ostringstream reportStream;

	const bool isValid = verifySampleImpl(args, result, reportStream);

	report = reportStream.str();

    return isValid;
}